

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int StopRequestRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  uint8 local_1a [2];
  RPLIDAR *pRStack_18;
  uchar reqbuf [2];
  RPLIDAR *pRPLIDAR_local;
  
  local_1a[0] = 0xa5;
  local_1a[1] = '%';
  pRStack_18 = pRPLIDAR;
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,local_1a,2);
  if (iVar1 == 0) {
    mSleep((long)pRStack_18->motordelay);
  }
  else {
    printf("Error writing data to a RPLIDAR. \n");
  }
  pRPLIDAR_local._4_4_ = (uint)(iVar1 != 0);
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int StopRequestRPLIDAR(RPLIDAR* pRPLIDAR)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	pRPLIDAR->nodes_cache->clear();
	if (SL_IS_FAIL(pRPLIDAR->drv->stop()))
	{
		printf("A RPLIDAR is not responding correctly : stop() failed. \n");
		return EXIT_FAILURE;
	}
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,STOP_REQUEST_RPLIDAR};

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	// Host systems should wait for at least 1 millisecond (ms) before sending another request.
	//uSleep(1000);
	// https://github.com/Slamtec/rplidar_sdk/issues/36.
	//mSleep(20);
	mSleep(pRPLIDAR->motordelay);

	return EXIT_SUCCESS;
}